

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::AddArchitectureFlags
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,string *lang,
          string *config,string *filterArch)

{
  cmMakefile *pcVar1;
  bool bVar2;
  __type _Var3;
  ulong uVar4;
  string *psVar5;
  string_view sVar6;
  byte local_2d2;
  cmValue local_2a8;
  cmValue deploymentTargetFlag;
  undefined1 local_280 [8];
  string deploymentTargetFlagVar;
  string local_258;
  cmValue local_238;
  cmValue deploymentTarget;
  string local_220;
  string *local_200;
  string_view local_1f8;
  string local_1e8;
  undefined1 local_1c8 [8];
  string arch_sysroot;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  string_view local_168;
  mapped_type *local_158;
  string *archSysroot;
  string *arch_1;
  iterator __end4;
  iterator __begin4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  cmValue local_120;
  cmValue sysrootFlag;
  undefined1 local_f8 [8];
  string sysrootFlagVar;
  string local_d0;
  cmValue local_b0;
  cmValue sysroot;
  string *arch;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  archs;
  allocator<char> local_59;
  string local_58;
  string *local_38;
  string *filterArch_local;
  string *config_local;
  string *lang_local;
  cmGeneratorTarget *target_local;
  string *flags_local;
  cmLocalGenerator *this_local;
  
  pcVar1 = this->Makefile;
  local_38 = filterArch;
  filterArch_local = config;
  config_local = lang;
  lang_local = (string *)target;
  target_local = (cmGeneratorTarget *)flags;
  flags_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"APPLE",&local_59);
  bVar2 = cmMakefile::IsOn(pcVar1,&local_58);
  local_2d2 = 0;
  if (bVar2) {
    local_2d2 = this->EmitUniversalBinaryFlags;
  }
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  if ((local_2d2 & 1) != 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range3);
    cmGeneratorTarget::GetAppleArchs
              ((cmGeneratorTarget *)lang_local,filterArch_local,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range3);
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range3);
    if ((!bVar2) &&
       ((((bVar2 = std::operator==(config_local,"C"), bVar2 ||
          (bVar2 = std::operator==(config_local,"CXX"), bVar2)) ||
         (bVar2 = std::operator==(config_local,"OBJC"), bVar2)) ||
        ((bVar2 = std::operator==(config_local,"OBJCXX"), bVar2 ||
         (bVar2 = std::operator==(config_local,"ASM"), bVar2)))))) {
      __end3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range3);
      arch = (string *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range3);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&arch), bVar2) {
        sysroot.Value =
             __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end3);
        uVar4 = std::__cxx11::string::empty();
        if (((uVar4 & 1) != 0) || (_Var3 = std::operator==(local_38,sysroot.Value), _Var3)) {
          std::__cxx11::string::operator+=((string *)target_local," -arch ");
          std::__cxx11::string::operator+=((string *)target_local,(string *)sysroot.Value);
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
    }
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"CMAKE_OSX_SYSROOT",
               (allocator<char> *)(sysrootFlagVar.field_2._M_local_buf + 0xf));
    local_b0 = cmMakefile::GetDefinition(pcVar1,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator((allocator<char> *)(sysrootFlagVar.field_2._M_local_buf + 0xf))
    ;
    bVar2 = cmValue::operator_cast_to_bool(&local_b0);
    if (bVar2) {
      psVar5 = cmValue::operator*[abi_cxx11_(&local_b0);
      bVar2 = std::operator==(psVar5,"/");
      if (bVar2) {
        cmValue::operator=(&local_b0,(nullptr_t)0x0);
      }
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sysrootFlag
                   ,"CMAKE_",config_local);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sysrootFlag
                   ,"_SYSROOT_FLAG");
    std::__cxx11::string::~string((string *)&sysrootFlag);
    local_120 = cmMakefile::GetDefinition(this->Makefile,(string *)local_f8);
    bVar2 = cmNonempty(local_120);
    if (bVar2) {
      bVar2 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::empty(&this->AppleArchSysroots);
      if ((bVar2) ||
         (bVar2 = AllAppleArchSysrootsAreTheSame
                            (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&__range3,local_b0), bVar2)) {
        local_200 = local_b0.Value;
        bVar2 = cmNonempty(local_b0);
        if (bVar2) {
          std::__cxx11::string::operator+=((string *)target_local," ");
          psVar5 = cmValue::operator*[abi_cxx11_(&local_120);
          std::__cxx11::string::operator+=((string *)target_local,(string *)psVar5);
          std::__cxx11::string::operator+=((string *)target_local," ");
          psVar5 = cmValue::operator*[abi_cxx11_(&local_b0);
          sVar6 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar5);
          deploymentTarget.Value = (string *)sVar6._M_len;
          cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                    (&local_220,&this->super_cmOutputConverter,sVar6,SHELL);
          std::__cxx11::string::operator+=((string *)target_local,(string *)&local_220);
          std::__cxx11::string::~string((string *)&local_220);
        }
      }
      else {
        __end4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__range3);
        arch_1 = (string *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range3);
        while( true ) {
          bVar2 = __gnu_cxx::operator!=
                            (&__end4,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)&arch_1);
          if (!bVar2) break;
          archSysroot = __gnu_cxx::
                        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator*(&__end4);
          local_158 = std::
                      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](&this->AppleArchSysroots,archSysroot);
          sVar6 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_158);
          local_168 = sVar6;
          bVar2 = cmIsOff(sVar6);
          if (!bVar2) {
            uVar4 = std::__cxx11::string::empty();
            if ((uVar4 & 1) == 0) {
              _Var3 = std::operator==(local_38,archSysroot);
              if (!_Var3) goto LAB_002ebed5;
            }
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&arch_sysroot.field_2 + 8)," -Xarch_",archSysroot);
            std::operator+(&local_188,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&arch_sysroot.field_2 + 8)," ");
            std::__cxx11::string::operator+=((string *)target_local,(string *)&local_188);
            std::__cxx11::string::~string((string *)&local_188);
            std::__cxx11::string::~string((string *)(arch_sysroot.field_2._M_local_buf + 8));
            psVar5 = cmValue::operator*[abi_cxx11_(&local_120);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1c8,psVar5,local_158);
            sVar6 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_1c8);
            local_1f8 = sVar6;
            cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                      (&local_1e8,&this->super_cmOutputConverter,sVar6,SHELL);
            std::__cxx11::string::operator+=((string *)target_local,(string *)&local_1e8);
            std::__cxx11::string::~string((string *)&local_1e8);
            std::__cxx11::string::~string((string *)local_1c8);
          }
LAB_002ebed5:
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end4);
        }
      }
    }
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,"CMAKE_OSX_DEPLOYMENT_TARGET",
               (allocator<char> *)(deploymentTargetFlagVar.field_2._M_local_buf + 0xf));
    local_238 = cmMakefile::GetDefinition(pcVar1,&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    std::allocator<char>::~allocator
              ((allocator<char> *)(deploymentTargetFlagVar.field_2._M_local_buf + 0xf));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &deploymentTargetFlag,"CMAKE_",config_local);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &deploymentTargetFlag,"_OSX_DEPLOYMENT_TARGET_FLAG");
    std::__cxx11::string::~string((string *)&deploymentTargetFlag);
    local_2a8 = cmMakefile::GetDefinition(this->Makefile,(string *)local_280);
    bVar2 = cmNonempty(local_2a8);
    if (bVar2) {
      bVar2 = cmNonempty(local_238);
      if (bVar2) {
        std::__cxx11::string::operator+=((string *)target_local," ");
        psVar5 = cmValue::operator*[abi_cxx11_(&local_2a8);
        std::__cxx11::string::operator+=((string *)target_local,(string *)psVar5);
        psVar5 = cmValue::operator*[abi_cxx11_(&local_238);
        std::__cxx11::string::operator+=((string *)target_local,(string *)psVar5);
      }
    }
    std::__cxx11::string::~string((string *)local_280);
    std::__cxx11::string::~string((string *)local_f8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range3);
  }
  return;
}

Assistant:

void cmLocalGenerator::AddArchitectureFlags(std::string& flags,
                                            cmGeneratorTarget const* target,
                                            const std::string& lang,
                                            const std::string& config,
                                            const std::string& filterArch)
{
  // Only add Apple specific flags on Apple platforms
  if (this->Makefile->IsOn("APPLE") && this->EmitUniversalBinaryFlags) {
    std::vector<std::string> archs;
    target->GetAppleArchs(config, archs);
    if (!archs.empty() &&
        (lang == "C" || lang == "CXX" || lang == "OBJC" || lang == "OBJCXX" ||
         lang == "ASM")) {
      for (std::string const& arch : archs) {
        if (filterArch.empty() || filterArch == arch) {
          flags += " -arch ";
          flags += arch;
        }
      }
    }

    cmValue sysroot = this->Makefile->GetDefinition("CMAKE_OSX_SYSROOT");
    if (sysroot && *sysroot == "/") {
      sysroot = nullptr;
    }
    std::string sysrootFlagVar = "CMAKE_" + lang + "_SYSROOT_FLAG";
    cmValue sysrootFlag = this->Makefile->GetDefinition(sysrootFlagVar);
    if (cmNonempty(sysrootFlag)) {
      if (!this->AppleArchSysroots.empty() &&
          !this->AllAppleArchSysrootsAreTheSame(archs, sysroot)) {
        for (std::string const& arch : archs) {
          std::string const& archSysroot = this->AppleArchSysroots[arch];
          if (cmIsOff(archSysroot)) {
            continue;
          }
          if (filterArch.empty() || filterArch == arch) {
            flags += " -Xarch_" + arch + " ";
            // Combine sysroot flag and path to work with -Xarch
            std::string arch_sysroot = *sysrootFlag + archSysroot;
            flags += this->ConvertToOutputFormat(arch_sysroot, SHELL);
          }
        }
      } else if (cmNonempty(sysroot)) {
        flags += " ";
        flags += *sysrootFlag;
        flags += " ";
        flags += this->ConvertToOutputFormat(*sysroot, SHELL);
      }
    }

    cmValue deploymentTarget =
      this->Makefile->GetDefinition("CMAKE_OSX_DEPLOYMENT_TARGET");
    std::string deploymentTargetFlagVar =
      "CMAKE_" + lang + "_OSX_DEPLOYMENT_TARGET_FLAG";
    cmValue deploymentTargetFlag =
      this->Makefile->GetDefinition(deploymentTargetFlagVar);
    if (cmNonempty(deploymentTargetFlag) && cmNonempty(deploymentTarget)) {
      flags += " ";
      flags += *deploymentTargetFlag;
      flags += *deploymentTarget;
    }
  }
}